

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkServerTest.cpp
# Opt level: O1

void __thiscall MyServerConnection::OnConnect(MyServerConnection *this)

{
  ostringstream *this_00;
  OutputWorker *this_01;
  long lVar1;
  pointer psVar2;
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  vector<std::shared_ptr<MyServerConnection>,_std::allocator<std::shared_ptr<MyServerConnection>_>_>
  connections;
  TonkStatus status;
  uint8_t incompressible_a [100];
  uint8_t incompressible_b [200];
  vector<std::shared_ptr<MyServerConnection>,_std::allocator<std::shared_ptr<MyServerConnection>_>_>
  local_258;
  TonkStatus local_240;
  TonkStatus local_228 [4];
  undefined1 local_1b8 [392];
  
  test::LogTonkStatus(&this->super_SDKConnection);
  tonk::SDKConnection::GetStatus(&local_240,&this->super_SDKConnection);
  tonk::SDKConnectionList<MyServerConnection>::GetList(&local_258,&this->Server->ConnectionList);
  if (local_258.
      super__Vector_base<std::shared_ptr<MyServerConnection>,_std::allocator<std::shared_ptr<MyServerConnection>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_258.
      super__Vector_base<std::shared_ptr<MyServerConnection>,_std::allocator<std::shared_ptr<MyServerConnection>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    this_00 = (ostringstream *)(local_1b8 + 0x10);
    psVar2 = local_258.
             super__Vector_base<std::shared_ptr<MyServerConnection>,_std::allocator<std::shared_ptr<MyServerConnection>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      tonk::SDKConnection::GetStatus
                (local_228,
                 &((psVar2->super___shared_ptr<MyServerConnection,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr)->super_SDKConnection);
      if ((psVar2->super___shared_ptr<MyServerConnection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr !=
          this) {
        if ((int)Logger.ChannelMinLevel < 3) {
          local_1b8._0_8_ = Logger.ChannelName;
          local_1b8._8_4_ = Info;
          std::__cxx11::ostringstream::ostringstream(this_00);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)this_00,Logger.Prefix._M_dataplus._M_p,
                     Logger.Prefix._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)this_00,"Broadcasting connection ",0x18);
          std::ostream::_M_insert<unsigned_long>((ulong)this_00);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," about ",7);
          std::ostream::_M_insert<unsigned_long>((ulong)this_00);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," connecting",0xb);
          this_01 = logger::OutputWorker::GetInstance();
          logger::OutputWorker::Write(this_01,(LogStringBuffer *)local_1b8);
          std::__cxx11::ostringstream::~ostringstream(this_00);
          std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
        }
        local_1b8._1_4_ = local_240.LocallyAssignedIdForRemoteHost;
        local_1b8[0] = 3;
        tonk::SDKConnection::Send
                  (&((psVar2->super___shared_ptr<MyServerConnection,_(__gnu_cxx::_Lock_policy)2>).
                    _M_ptr)->super_SDKConnection,(LogStringBuffer *)local_1b8,5,0x32);
      }
      local_1b8._1_4_ = local_228[0].LocallyAssignedIdForRemoteHost;
      local_1b8[0] = 3;
      tonk::SDKConnection::Send(&this->super_SDKConnection,(LogStringBuffer *)local_1b8,5,0x32);
      psVar2 = psVar2 + 1;
    } while (psVar2 != local_258.
                       super__Vector_base<std::shared_ptr<MyServerConnection>,_std::allocator<std::shared_ptr<MyServerConnection>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  auVar3 = vpmovsxbq_avx512f(ZEXT816(0x3f3e3d3c3b3a3938));
  auVar4 = vpmovsxbq_avx512f(ZEXT816(0x3736353433323130));
  auVar5 = vpmovsxbq_avx512f(ZEXT816(0x2f2e2d2c2b2a2928));
  auVar6 = vpmovsxbq_avx512f(ZEXT816(0x2726252423222120));
  auVar7 = vpmovsxbq_avx512f(ZEXT816(0x1f1e1d1c1b1a1918));
  auVar8 = vpmovsxbq_avx512f(ZEXT816(0x1716151413121110));
  auVar9 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
  auVar10 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
  auVar11 = vmovdqa64_avx512f(_DAT_0010b240);
  lVar1 = 0;
  auVar12 = vpbroadcastq_avx512f(ZEXT816(100));
  auVar13 = vpbroadcastq_avx512f(ZEXT816(0x40));
  auVar14 = vpbroadcastb_avx512bw(ZEXT116(0x40));
  do {
    vpcmpuq_avx512f(auVar10,auVar12,1);
    vpcmpuq_avx512f(auVar9,auVar12,1);
    vpcmpuq_avx512f(auVar8,auVar12,1);
    vpcmpuq_avx512f(auVar7,auVar12,1);
    vpcmpuq_avx512f(auVar6,auVar12,1);
    vpcmpuq_avx512f(auVar5,auVar12,1);
    vpcmpuq_avx512f(auVar4,auVar12,1);
    vpcmpuq_avx512f(auVar3,auVar12,1);
    auVar15 = vmovdqu8_avx512bw(auVar11);
    *(undefined1 (*) [64])((long)&local_228[0].Flags + lVar1) = auVar15;
    lVar1 = lVar1 + 0x40;
    auVar10 = vpaddq_avx512f(auVar10,auVar13);
    auVar9 = vpaddq_avx512f(auVar9,auVar13);
    auVar8 = vpaddq_avx512f(auVar8,auVar13);
    auVar7 = vpaddq_avx512f(auVar7,auVar13);
    auVar6 = vpaddq_avx512f(auVar6,auVar13);
    auVar5 = vpaddq_avx512f(auVar5,auVar13);
    auVar4 = vpaddq_avx512f(auVar4,auVar13);
    auVar3 = vpaddq_avx512f(auVar3,auVar13);
    auVar11 = vpaddb_avx512bw(auVar11,auVar14);
  } while (lVar1 != 0x80);
  auVar3 = vpmovsxbq_avx512f(ZEXT816(0x3f3e3d3c3b3a3938));
  auVar4 = vpmovsxbq_avx512f(ZEXT816(0x3736353433323130));
  auVar5 = vpmovsxbq_avx512f(ZEXT816(0x2f2e2d2c2b2a2928));
  auVar6 = vpmovsxbq_avx512f(ZEXT816(0x2726252423222120));
  auVar7 = vpmovsxbq_avx512f(ZEXT816(0x1f1e1d1c1b1a1918));
  auVar8 = vpmovsxbq_avx512f(ZEXT816(0x1716151413121110));
  auVar9 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
  auVar10 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
  auVar11 = vmovdqa64_avx512f(_DAT_0010b240);
  lVar1 = 0;
  auVar12 = vpbroadcastq_avx512f(ZEXT816(200));
  auVar15 = vpbroadcastb_avx512bw(ZEXT116(200));
  do {
    vpcmpuq_avx512f(auVar10,auVar12,1);
    vpcmpuq_avx512f(auVar9,auVar12,1);
    vpcmpuq_avx512f(auVar8,auVar12,1);
    vpcmpuq_avx512f(auVar7,auVar12,1);
    vpcmpuq_avx512f(auVar6,auVar12,1);
    vpcmpuq_avx512f(auVar5,auVar12,1);
    vpcmpuq_avx512f(auVar4,auVar12,1);
    vpcmpuq_avx512f(auVar3,auVar12,1);
    auVar16 = vpsubb_avx512bw(auVar15,auVar11);
    auVar16 = vmovdqu8_avx512bw(auVar16);
    *(undefined1 (*) [64])(local_1b8 + lVar1) = auVar16;
    lVar1 = lVar1 + 0x40;
    auVar10 = vpaddq_avx512f(auVar10,auVar13);
    auVar9 = vpaddq_avx512f(auVar9,auVar13);
    auVar8 = vpaddq_avx512f(auVar8,auVar13);
    auVar7 = vpaddq_avx512f(auVar7,auVar13);
    auVar6 = vpaddq_avx512f(auVar6,auVar13);
    auVar5 = vpaddq_avx512f(auVar5,auVar13);
    auVar4 = vpaddq_avx512f(auVar4,auVar13);
    auVar3 = vpaddq_avx512f(auVar3,auVar13);
    auVar11 = vpaddb_avx512bw(auVar11,auVar14);
  } while (lVar1 != 0x100);
  tonk::SDKConnection::Send(&this->super_SDKConnection,local_228,100,0x9b);
  tonk::SDKConnection::Send(&this->super_SDKConnection,local_1b8,200,0x37);
  std::
  vector<std::shared_ptr<MyServerConnection>,_std::allocator<std::shared_ptr<MyServerConnection>_>_>
  ::~vector(&local_258);
  return;
}

Assistant:

void MyServerConnection::OnConnect()
{
    LogTonkStatus(this);

    TonkStatus status = GetStatus();

    auto connections = Server->ConnectionList.GetList();
    for (auto& connection : connections)
    {
        TonkStatus cs = connection->GetStatus();

        if (connection.get() != this)
        {
            Logger.Info("Broadcasting connection ", cs.LocallyAssignedIdForRemoteHost,
                " about ", status.LocallyAssignedIdForRemoteHost, " connecting");

            uint8_t data[1 + 4];
            data[0] = ID_ConnectionAdded;
            tonk::WriteU32_LE(data + 1, status.LocallyAssignedIdForRemoteHost);
            connection->Send(data, sizeof(data), TonkChannel_Reliable0);
        }

        uint8_t data[1 + 4];
        data[0] = ID_ConnectionAdded;
        tonk::WriteU32_LE(data + 1, cs.LocallyAssignedIdForRemoteHost);
        Send(data, sizeof(data), TonkChannel_Reliable0);
    }

    // Send two buffers in quick succession in unused channels.
    // The goal is to get the Flush() function to insert a sync
    // frame between these two buffers to test this rare case.
    static const int kBytesA = 100;
    static const int kBytesB = 200;
    uint8_t incompressible_a[kBytesA];
    uint8_t incompressible_b[kBytesB];
    for (int i = 0; i < kBytesA; ++i) {
        incompressible_a[i] = (uint8_t)(i);
    }
    for (int i = 0; i < kBytesB; ++i) {
        incompressible_b[i] = (uint8_t)(kBytesB - i);
    }
    Send(incompressible_a, kBytesA, TonkChannel_LowPri0 + 5);
    Send(incompressible_b, kBytesB, TonkChannel_Reliable0 + 5);
}